

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ClassRandomizeFunction::~ClassRandomizeFunction(ClassRandomizeFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ClassRandomizeFunction((ClassRandomizeFunction *)0xaf2128);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ClassRandomizeFunction() :
        SystemSubroutine(KnownSystemName::Randomize, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }